

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

Duration __thiscall
absl::lts_20250127::anon_unknown_1::MakeDurationFromU128
          (anon_unknown_1 *this,uint128 u128,bool is_neg)

{
  Duration DVar1;
  Duration DVar2;
  Duration DVar3;
  Duration DVar4;
  HiRep HVar5;
  ulong uVar6;
  uint32_t uVar7;
  byte bVar8;
  Duration DVar9;
  
  uVar6 = u128.lo_;
  DVar9.rep_lo_ = (uint32_t)u128.hi_;
  bVar8 = (byte)u128.hi_;
  if (uVar6 == 0) {
    HVar5 = (HiRep)((ulong)this / 4000000000);
  }
  else {
    if (1999999999 < uVar6) {
      if (((this == (anon_unknown_1 *)0x0 && uVar6 == 2000000000) & bVar8) == 0) {
        if (bVar8 != 0) {
          DVar9.rep_hi_.lo_ = 0xffffffff;
          DVar9.rep_hi_.hi_ = 0xffffffff;
          DVar9 = operator-((lts_20250127 *)0x7fffffffffffffff,DVar9);
          return DVar9;
        }
        DVar4.rep_lo_ = 0xffffffff;
        DVar4.rep_hi_.lo_ = 0xffffffff;
        DVar4.rep_hi_.hi_ = 0x7fffffff;
        return DVar4;
      }
      uVar6 = 0x8000000000000000;
      goto LAB_0026c549;
    }
    HVar5 = (HiRep)__udivti3(this,uVar6,4000000000,0);
  }
  uVar7 = (int)this + HVar5.lo_ * 0x1194d800;
  DVar1.rep_lo_ = uVar7;
  DVar1.rep_hi_ = HVar5;
  if (bVar8 == 0) {
    return DVar1;
  }
  if (uVar7 != 0) {
    DVar2.rep_lo_ = 4000000000 - uVar7;
    DVar2.rep_hi_ = (HiRep)~(ulong)HVar5;
    return DVar2;
  }
  uVar6 = -(long)HVar5;
LAB_0026c549:
  DVar3.rep_lo_ = 0;
  DVar3.rep_hi_.lo_ = (int)uVar6;
  DVar3.rep_hi_.hi_ = (int)(uVar6 >> 0x20);
  return DVar3;
}

Assistant:

inline Duration MakeDurationFromU128(uint128 u128, bool is_neg) {
  int64_t rep_hi;
  uint32_t rep_lo;
  const uint64_t h64 = Uint128High64(u128);
  const uint64_t l64 = Uint128Low64(u128);
  if (h64 == 0) {  // fastpath
    const uint64_t hi = l64 / kTicksPerSecond;
    rep_hi = static_cast<int64_t>(hi);
    rep_lo = static_cast<uint32_t>(l64 - hi * kTicksPerSecond);
  } else {
    // kMaxRepHi64 is the high 64 bits of (2^63 * kTicksPerSecond).
    // Any positive tick count whose high 64 bits are >= kMaxRepHi64
    // is not representable as a Duration.  A negative tick count can
    // have its high 64 bits == kMaxRepHi64 but only when the low 64
    // bits are all zero, otherwise it is not representable either.
    const uint64_t kMaxRepHi64 = 0x77359400UL;
    if (h64 >= kMaxRepHi64) {
      if (is_neg && h64 == kMaxRepHi64 && l64 == 0) {
        // Avoid trying to represent -kint64min below.
        return time_internal::MakeDuration(kint64min);
      }
      return is_neg ? -InfiniteDuration() : InfiniteDuration();
    }
    const uint128 kTicksPerSecond128 = static_cast<uint64_t>(kTicksPerSecond);
    const uint128 hi = u128 / kTicksPerSecond128;
    rep_hi = static_cast<int64_t>(Uint128Low64(hi));
    rep_lo =
        static_cast<uint32_t>(Uint128Low64(u128 - hi * kTicksPerSecond128));
  }
  if (is_neg) {
    rep_hi = -rep_hi;
    if (rep_lo != 0) {
      --rep_hi;
      rep_lo = kTicksPerSecond - rep_lo;
    }
  }
  return time_internal::MakeDuration(rep_hi, rep_lo);
}